

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O0

void anon_unknown.dwarf_24287c::fillPixelsGray(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_3_2::Rgba> *in_RDI;
  Rgba *p;
  int x;
  int y;
  float in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      pRVar1 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](in_RDI,(long)local_14);
      pRVar1 = pRVar1 + local_18;
      sin((double)local_18 * 0.05 + -((double)local_14 * 0.05));
      Imath_3_2::half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
      (pRVar1->g)._h = (pRVar1->r)._h;
      (pRVar1->b)._h = (pRVar1->r)._h;
      cos((double)local_18 * 0.05 + -((double)local_14 * 0.05));
      Imath_3_2::half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void
fillPixelsGray (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.8 + 0.5 * sin (x * 0.05 - y * 0.05);
            p.g = p.r;
            p.b = p.r;
            p.a = 0.5 + 0.5 * cos (x * 0.05 - y * 0.05);
        }
    }
}